

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint8 *puVar1;
  uint32 value_00;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  value_00 = (*value->_vptr_MessageLite[0xf])(value);
  io::CodedOutputStream::WriteVarint32(output,value_00);
  if ((int)value_00 <= output->buffer_size_) {
    puVar1 = output->buffer_;
    output->buffer_ = puVar1 + (int)value_00;
    output->buffer_size_ = output->buffer_size_ - value_00;
    if (puVar1 != (uint8 *)0x0) {
      uVar3 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar3 = (ulong)output->serialization_deterministic_override_;
      }
      iVar2 = (*value->_vptr_MessageLite[0x10])(value,(ulong)(uVar3 != 0),puVar1);
      if (CONCAT44(extraout_var,iVar2) - (long)puVar1 != (long)(int)value_00) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
                   ,0x247);
        other = LogMessage::operator<<(&local_60,"CHECK failed: (end - target) == (size): ");
        LogFinisher::operator=(&local_61,other);
        LogMessage::~LogMessage(&local_60);
      }
      return;
    }
  }
  (*value->_vptr_MessageLite[0xd])(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.InternalSerializeWithCachedSizesToArray(
        output->IsSerializationDeterministic(), target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
}